

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

void __thiscall
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          stringstream *ss,Index agI,Index ts,Index last_ts,Index aohI,Index ohI,TypeCluster *tc,
          Index tI,Index aI,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  sp_counted_base *psVar2;
  MultiAgentDecisionProcessDiscreteInterface *pMVar3;
  BayesianGameWithClusterInfo *this_00;
  Index aohI_00;
  Index ohIndex;
  Index tcI;
  uint aI_00;
  const_reference ppJVar4;
  reference pvVar5;
  ulong uVar6;
  TypeCluster *tc_00;
  ostream *poVar7;
  Index in_stack_ffffffffffffff00;
  uint local_c0;
  shared_count sStack_a0;
  JointPolicyPureVectorForClusteredBG *local_98;
  value_type local_90;
  string local_88;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_68;
  string local_50 [32];
  
  local_98 = this;
  ppJVar4 = std::
            vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            ::at(jpolBGVec,(ulong)ts);
  local_90 = *ppJVar4;
  pvVar5 = std::
           vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
           ::at(bgVec,(ulong)ts);
  this_00 = pvVar5->px;
  sStack_a0.pi_ = (pvVar5->pn).pi_;
  psVar2 = (pvVar5->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_c0 = 0;
  while( true ) {
    pMVar3 = (pu->super_PlanningUnitMADPDiscrete)._m_madp;
    uVar6 = (**(code **)((long)*pMVar3 + 0xc0))(pMVar3,agI);
    if (uVar6 <= local_c0) break;
    aohI_00 = PlanningUnitMADPDiscrete::GetSuccessorAOHI
                        (&pu->super_PlanningUnitMADPDiscrete,agI,aohI,aI,local_c0);
    ohIndex = PlanningUnitMADPDiscrete::GetSuccessorOHI
                        (&pu->super_PlanningUnitMADPDiscrete,agI,ohI,local_c0);
    tcI = BayesianGameWithClusterInfo::FindTypeClusterIndex(this_00,agI,tc,aI,local_c0);
    tc_00 = BayesianGameWithClusterInfo::GetTypeCluster(this_00,agI,tcI);
    aI_00 = (*(local_90->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                      (local_90,(ulong)agI,(ulong)tcI);
    PlanningUnitMADPDiscrete::SoftPrintObservationHistory_abi_cxx11_
              (&local_88,&pu->super_PlanningUnitMADPDiscrete,agI,ohIndex);
    poVar7 = std::operator<<((ostream *)(ss + 0x10),(string *)&local_88);
    poVar7 = std::operator<<(poVar7," -> ");
    (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xc])
              (local_50,pu,(ulong)agI,(ulong)aI_00);
    poVar7 = std::operator<<(poVar7,local_50);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_88);
    if (ts + 1 <= last_ts) {
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::vector(&local_68,bgVec);
      RecursivelyPrintPolicyForAgent
                (local_98,pu,ss,agI,ts + 1,last_ts,aohI_00,ohIndex,tc_00,in_stack_ffffffffffffff00,
                 aI_00,jpolBGVec,&local_68);
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::~vector(&local_68);
    }
    local_c0 = local_c0 + 1;
  }
  boost::detail::shared_count::~shared_count(&sStack_a0);
  return;
}

Assistant:

void
JointPolicyPureVectorForClusteredBG::RecursivelyPrintPolicyForAgent(
        const PlanningUnitDecPOMDPDiscrete* pu
        , stringstream& ss
        , Index agI
        , Index ts
        , Index last_ts
        , Index aohI    //the previous aohI
        , Index ohI    //the previous ohI
        , const TypeCluster* tc //the previous typecluster that represents aohI
        , Index tI //the index of tc (in the previous bg)
        , Index aI //the action taken for tI (i.e. for aohI)
        , const vector<const JointPolicyDiscretePure* >& jpolBGVec
        , vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec
    )const 
{    
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);

#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>Starting RecurivelyPrintPolicyForAgent for " << endl;
    cout << "agI="<<agI<<endl;
    cout << "ts="<<ts<<endl;
    cout << "aohI="<<aohI<<endl;
    cout << "ohI="<<ohI<<endl;
    cout << "tI="<<tI<<endl;
    cout << "aI="<<aI<<endl;
    //cout << "BG: " << endl << bg->SoftPrint();
    cout << endl;
#endif
    Index obsI = 0;
    for(obsI=0; obsI < pu->GetNrObservations(agI); obsI++)
    {
        Index n_aohI = pu->GetSuccessorAOHI(agI, aohI, aI, obsI);
        Index n_ohI = pu->GetSuccessorOHI(agI, ohI, obsI);
        ///NOTE: this can throw an error if there is no type 
        //for the history (e.g. if the histories prob. is 0)
        Index n_tI = 0;
        try{
            n_tI = bg->FindTypeClusterIndex(agI, tc, aI, obsI);
        } catch (E& e) {
            ss << pu->SoftPrintObservationHistory(agI, n_ohI) << 
                " *CAN'T OCCUR* -> ANY "<< endl;
            continue;
        }
        
        const TypeCluster* n_tc =  bg->GetTypeCluster(agI, n_tI);
        Index n_aI = jpolBG->GetActionIndex(agI, n_tI);
        ss << pu->SoftPrintObservationHistory(agI, n_ohI) << " -> " <<
            pu->SoftPrintAction(agI, n_aI) << endl;

        Index n_ts = ts+1;
        if(n_ts  <= last_ts) // ts + 1 <= h - 1
        {
            RecursivelyPrintPolicyForAgent(
                pu, ss, agI, n_ts, last_ts, n_aohI, n_ohI, 
                n_tc, n_tI, n_aI, jpolBGVec, bgVec);
        }
        else
        {
#if DEBUG_RECURSIVE_SPRINT
            cout << "this is last stage, no further RecurivelyPrintPolicyForAgent"<<endl;
#endif
        }
    }
}